

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O3

size_t propagatemark(global_State *g)

{
  uint8_t uVar1;
  char cVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  bool bVar6;
  cTValue *pcVar7;
  char *pcVar8;
  ulong uVar9;
  uint uVar10;
  GCfunc *fn;
  GCfunc *fn_00;
  uint *puVar11;
  GCobj *pGVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  
  uVar4 = (g->gc).gray.gcptr32;
  fn_00 = (GCfunc *)(ulong)uVar4;
  uVar1 = (fn_00->c).gct;
  (fn_00->c).marked = (fn_00->c).marked | 4;
  (g->gc).gray.gcptr32 = (fn_00->c).gclist.gcptr32;
  if (uVar1 != '\v') {
    if (uVar1 == '\b') {
      gc_traverse_func(g,fn_00);
      if ((fn_00->c).ffid != '\0') {
        return (ulong)(fn_00->c).nupvalues * 8 + 0x20;
      }
      return (ulong)(fn_00->c).nupvalues * 4 + 0x14;
    }
    if (uVar1 == '\a') {
      gc_traverse_proto(g,(GCproto *)&fn_00->c);
      return (ulong)(fn_00->c).upvalue[0].u32.lo;
    }
    if (uVar1 == '\x06') {
      (fn_00->c).gclist.gcptr32 = (g->gc).grayagain.gcptr32;
      (g->gc).grayagain.gcptr32 = uVar4;
      (fn_00->c).marked = (fn_00->c).marked & 0xfb;
      gc_traverse_thread(g,(lua_State *)&fn_00->c);
      return (ulong)*(uint *)((long)fn_00 + 0x38) * 8 + 0x40;
    }
    gc_traverse_trace(g,(GCtrace *)&fn_00->c);
    uVar3._0_1_ = *(uint8_t *)((long)fn_00 + 6);
    uVar3._1_1_ = *(uint8_t *)((long)fn_00 + 7);
    return (ulong)((uint)uVar3 * 0xc) + (ulong)((fn_00->c).env.gcptr32 - *(int *)&(fn_00->c).f) * 8
           + (ulong)*(uint *)((long)&(fn_00->c).f + 4) * 4 + 0x60;
  }
  pGVar12 = (GCobj *)(ulong)(fn_00->c).pc.ptr32;
  uVar15 = 0;
  if (pGVar12 == (GCobj *)0x0) {
LAB_00110b77:
    uVar10 = uVar15;
    uVar4 = *(uint *)&(fn_00->c).f;
    bVar6 = true;
    if ((ulong)uVar4 != 0) {
      uVar14 = 0;
      do {
        uVar9 = (ulong)(fn_00->c).env.gcptr32;
        if ((*(int *)(uVar9 + 4 + uVar14 * 8) + 0xdU < 9) &&
           (pGVar12 = (GCobj *)(ulong)*(uint *)(uVar9 + uVar14 * 8),
           ((pGVar12->gch).marked & 3) != 0)) {
          gc_mark(g,pGVar12);
        }
        uVar14 = uVar14 + 1;
      } while (uVar4 != uVar14);
    }
LAB_00110bb3:
    uVar4 = *(uint *)((long)&(fn_00->c).f + 4);
    if (uVar4 != 0) {
      uVar14 = (ulong)(fn_00->l).uvptr[0].gcptr32;
      uVar9 = 0;
      do {
        if (*(int *)(uVar14 + 4 + uVar9 * 0x18) != -1) {
          puVar11 = (uint *)(uVar9 * 0x18 + uVar14);
          if ((((uVar10 & 8) == 0) && (puVar11[3] + 0xd < 9)) &&
             (((((GCobj *)(ulong)puVar11[2])->gch).marked & 3) != 0)) {
            gc_mark(g,(GCobj *)(ulong)puVar11[2]);
          }
          if (((bVar6) && (puVar11[1] + 0xd < 9)) &&
             (((((GCobj *)(ulong)*puVar11)->gch).marked & 3) != 0)) {
            gc_mark(g,(GCobj *)(ulong)*puVar11);
          }
        }
        uVar15 = (int)uVar9 + 1;
        uVar9 = (ulong)uVar15;
      } while (uVar15 <= uVar4);
    }
    if ((int)uVar10 < 1) goto LAB_00110c3f;
  }
  else {
    if (((pGVar12->gch).marked & 3) != 0) {
      gc_mark(g,pGVar12);
    }
    if (((((pGVar12->gch).unused1 & 8) != 0) ||
        (pcVar7 = lj_meta_cache(&pGVar12->tab,MM_mode,(GCstr *)(ulong)g->gcroot[3].gcptr32),
        pcVar7 == (cTValue *)0x0)) || (uVar15 = 0, (pcVar7->field_2).it != 0xfffffffb))
    goto LAB_00110b77;
    pcVar8 = (char *)((ulong)(pcVar7->u32).lo + 0x10);
    uVar10 = 0;
    while (cVar2 = *pcVar8, cVar2 != '\0') {
      pcVar8 = pcVar8 + 1;
      if (cVar2 == 'v') {
        uVar10 = uVar10 | 0x10;
      }
      else if (cVar2 == 'k') {
        uVar10 = uVar10 | 8;
      }
    }
    if (uVar10 == 0) {
      uVar15 = 0;
      goto LAB_00110b77;
    }
    uVar15 = 0xffffffef;
    if (g->gcroot[0x26].gcptr32 == uVar4) goto LAB_00110b77;
    (fn_00->c).marked = (byte)uVar10 | (fn_00->c).marked & 0xe7;
    (fn_00->c).gclist.gcptr32 = (g->gc).weak.gcptr32;
    (g->gc).weak.gcptr32 = uVar4;
    if (uVar10 != 0x18) {
      uVar15 = uVar10;
      if ((uVar10 & 0x10) == 0) goto LAB_00110b77;
      bVar6 = false;
      goto LAB_00110bb3;
    }
  }
  (fn_00->c).marked = (fn_00->c).marked & 0xfb;
LAB_00110c3f:
  iVar5 = *(int *)((long)&(fn_00->c).f + 4);
  lVar13 = 0;
  if (iVar5 != 0) {
    lVar13 = (ulong)(iVar5 + 1) * 0x18;
  }
  return lVar13 + (ulong)*(uint *)&(fn_00->c).f * 8 + 0x20;
}

Assistant:

static size_t propagatemark(global_State *g)
{
  GCobj *o = gcref(g->gc.gray);
  int gct = o->gch.gct;
  lj_assertG(isgray(o), "propagation of non-gray object");
  gray2black(o);
  setgcrefr(g->gc.gray, o->gch.gclist);  /* Remove from gray list. */
  if (LJ_LIKELY(gct == ~LJ_TTAB)) {
    GCtab *t = gco2tab(o);
    if (gc_traverse_tab(g, t) > 0)
      black2gray(o);  /* Keep weak tables gray. */
    return sizeof(GCtab) + sizeof(TValue) * t->asize +
			   (t->hmask ? sizeof(Node) * (t->hmask + 1) : 0);
  } else if (LJ_LIKELY(gct == ~LJ_TFUNC)) {
    GCfunc *fn = gco2func(o);
    gc_traverse_func(g, fn);
    return isluafunc(fn) ? sizeLfunc((MSize)fn->l.nupvalues) :
			   sizeCfunc((MSize)fn->c.nupvalues);
  } else if (LJ_LIKELY(gct == ~LJ_TPROTO)) {
    GCproto *pt = gco2pt(o);
    gc_traverse_proto(g, pt);
    return pt->sizept;
  } else if (LJ_LIKELY(gct == ~LJ_TTHREAD)) {
    lua_State *th = gco2th(o);
    setgcrefr(th->gclist, g->gc.grayagain);
    setgcref(g->gc.grayagain, o);
    black2gray(o);  /* Threads are never black. */
    gc_traverse_thread(g, th);
    return sizeof(lua_State) + sizeof(TValue) * th->stacksize;
  } else {
#if LJ_HASJIT
    GCtrace *T = gco2trace(o);
    gc_traverse_trace(g, T);
    return ((sizeof(GCtrace)+7)&~7) + (T->nins-T->nk)*sizeof(IRIns) +
	   T->nsnap*sizeof(SnapShot) + T->nsnapmap*sizeof(SnapEntry);
#else
    lj_assertG(0, "bad GC type %d", gct);
    return 0;
#endif
  }
}